

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Btree **ppBtree;
  int *piVar1;
  sqlite3 *db;
  Db *pDVar2;
  Pager *pPVar3;
  Btree *pBVar4;
  char *pcVar5;
  Btree *pBVar6;
  Schema *pSVar7;
  undefined7 uVar8;
  u8 uVar9;
  undefined7 uVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  char *zRight;
  Db *pDVar14;
  Schema *pSVar15;
  long lVar16;
  u64 n;
  long lVar17;
  char *zErrDyn;
  uint flags;
  char *zPath;
  char *zErr;
  sqlite3_vfs *pVfs;
  char *local_68;
  Btree *local_60;
  uint local_54;
  char *local_50;
  char *local_48;
  char *local_40;
  sqlite3_vfs *local_38;
  
  db = context->pOut->db;
  iVar11 = 0;
  local_50 = (char *)0x0;
  local_40 = (char *)0x0;
  local_68 = (char *)0x0;
  pcVar13 = (char *)sqlite3ValueText(*argv,'\x01');
  zRight = (char *)sqlite3ValueText(argv[1],'\x01');
  if (pcVar13 == (char *)0x0) {
    pcVar13 = "";
  }
  if (zRight == (char *)0x0) {
    zRight = "";
  }
  if (db->nDb < db->aLimit[7] + 2) {
    if (db->autoCommit == '\0') {
      pcVar13 = "cannot ATTACH database within transaction";
      iVar11 = 0;
    }
    else {
      lVar16 = (long)db->nDb;
      local_60 = (Btree *)context;
      local_48 = pcVar13;
      if (0 < lVar16) {
        pDVar14 = db->aDb;
        lVar17 = 0;
        do {
          iVar11 = sqlite3_stricmp(*(char **)((long)&pDVar14->zName + lVar17),zRight);
          if (iVar11 == 0) {
            iVar11 = 0;
            local_68 = sqlite3MPrintf(db,"database %s is already in use",zRight);
            context = (sqlite3_context *)local_60;
            goto LAB_0016ee15;
          }
          lVar17 = lVar17 + 0x20;
        } while (lVar16 << 5 != lVar17);
      }
      if (db->aDb == db->aDbStatic) {
        pDVar14 = (Db *)sqlite3DbMallocRaw(db,0x60);
        if (pDVar14 == (Db *)0x0) {
          return;
        }
        pDVar2 = db->aDb;
        pcVar13 = pDVar2->zName;
        pBVar4 = pDVar2->pBt;
        uVar9 = pDVar2->safety_level;
        uVar10 = *(undefined7 *)&pDVar2->field_0x11;
        pSVar15 = pDVar2->pSchema;
        pcVar5 = pDVar2[1].zName;
        pBVar6 = pDVar2[1].pBt;
        uVar8 = *(undefined7 *)&pDVar2[1].field_0x11;
        pSVar7 = pDVar2[1].pSchema;
        pDVar14[1].safety_level = pDVar2[1].safety_level;
        *(undefined7 *)&pDVar14[1].field_0x11 = uVar8;
        pDVar14[1].pSchema = pSVar7;
        pDVar14[1].zName = pcVar5;
        pDVar14[1].pBt = pBVar6;
        pDVar14->safety_level = uVar9;
        *(undefined7 *)&pDVar14->field_0x11 = uVar10;
        pDVar14->pSchema = pSVar15;
        pDVar14->zName = pcVar13;
        pDVar14->pBt = pBVar4;
      }
      else {
        pDVar14 = (Db *)sqlite3DbRealloc(db,db->aDb,lVar16 * 0x20 + 0x20);
        if (pDVar14 == (Db *)0x0) {
          return;
        }
      }
      context = (sqlite3_context *)local_60;
      db->aDb = pDVar14;
      iVar11 = db->nDb;
      *(undefined8 *)&pDVar14[iVar11].safety_level = 0;
      *(Schema **)(&pDVar14[iVar11].safety_level + 8) = (Schema *)0x0;
      pDVar14[iVar11].zName = (char *)0x0;
      pDVar14[iVar11].pBt = (Btree *)0x0;
      local_54 = db->openFlags;
      iVar12 = sqlite3ParseUri(db->pVfs->zName,local_48,&local_54,&local_38,&local_50,&local_40);
      pcVar13 = local_40;
      if (iVar12 != 0) {
        if (iVar12 == 7) {
          db->mallocFailed = '\x01';
        }
        *(int *)((long)&((Btree *)context)->pNext + 4) = 1;
        *(u8 *)((long)&((Btree *)context)->pPrev + 1) = '\x01';
        sqlite3VdbeMemSetStr
                  ((Mem *)((Btree *)context)->db,local_40,-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3_free(pcVar13);
        return;
      }
      pDVar14 = pDVar14 + iVar11;
      local_54 = local_54 | 0x100;
      ppBtree = &pDVar14->pBt;
      iVar12 = sqlite3BtreeOpen(local_38,local_50,db,ppBtree,0,local_54);
      sqlite3_free(local_50);
      db->nDb = db->nDb + 1;
      if (iVar12 == 0) {
        pSVar15 = sqlite3SchemaGet(db,pDVar14->pBt);
        pDVar14->pSchema = pSVar15;
        if (pSVar15 == (Schema *)0x0) {
          iVar12 = 7;
        }
        else {
          iVar12 = 0;
          if ((pSVar15->file_format != '\0') && (pSVar15->enc != db->enc)) {
            local_68 = sqlite3MPrintf(db,
                                      "attached databases must use the same text encoding as main database"
                                     );
            iVar12 = 1;
          }
        }
        sqlite3BtreeEnter(*ppBtree);
        local_60 = *ppBtree;
        pPVar3 = local_60->pBt->pPager;
        if (pPVar3->tempFile == '\0') {
          if ((pPVar3->pWal == (Wal *)0x0) || (pPVar3->pWal->exclusiveMode != '\x02')) {
            pPVar3->exclusiveMode = db->dfltLockMode;
          }
        }
        iVar11 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
        sqlite3BtreeSecureDelete(local_60,iVar11);
        sqlite3BtreeSetPagerFlags(*ppBtree,db->flags & 0x1cU | 3);
        pBVar4 = *ppBtree;
        if (pBVar4->sharable != '\0') {
          piVar1 = &pBVar4->wantToLock;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            unlockBtreeMutex(pBVar4);
          }
        }
      }
      else if (iVar12 == 0x13) {
        local_68 = sqlite3MPrintf(db,"database is already attached");
        iVar12 = 1;
      }
      pDVar14->safety_level = '\x03';
      lVar16 = -1;
      do {
        lVar17 = lVar16 + 1;
        lVar16 = lVar16 + 1;
      } while (zRight[lVar17] != '\0');
      n = (ulong)((uint)lVar16 & 0x3fffffff) + 1;
      pcVar13 = (char *)sqlite3DbMallocRaw(db,n);
      if (pcVar13 == (char *)0x0) {
        iVar11 = 7;
      }
      else {
        memcpy(pcVar13,zRight,n);
        iVar11 = 0;
      }
      pDVar14->zName = pcVar13;
      if (iVar12 != 0) {
        iVar11 = iVar12;
      }
      if (iVar11 == 0) {
        sqlite3BtreeEnterAll(db);
        iVar11 = sqlite3Init(db,&local_68);
        sqlite3BtreeLeaveAll(db);
      }
      if (iVar11 == 0) {
        return;
      }
      lVar16 = (long)db->nDb + -1;
      pBVar4 = db->aDb[lVar16].pBt;
      if (pBVar4 != (Btree *)0x0) {
        sqlite3BtreeClose(pBVar4);
        pDVar14 = db->aDb;
        pDVar14[lVar16].pBt = (Btree *)0x0;
        pDVar14[lVar16].pSchema = (Schema *)0x0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = (int)lVar16;
      if ((iVar11 != 0xc0a) && (iVar11 != 7)) {
        if (local_68 == (char *)0x0) {
          local_68 = sqlite3MPrintf(db,"unable to open database: %s",local_48);
        }
        goto LAB_0016ee15;
      }
      db->mallocFailed = '\x01';
      sqlite3DbFree(db,local_68);
      pcVar13 = "out of memory";
    }
    local_68 = sqlite3MPrintf(db,pcVar13);
  }
  else {
    local_68 = sqlite3MPrintf(db,"too many attached databases - max %d");
  }
LAB_0016ee15:
  if (local_68 != (char *)0x0) {
    *(int *)((long)&((Btree *)context)->pNext + 4) = 1;
    *(u8 *)((long)&((Btree *)context)->pPrev + 1) = '\x01';
    sqlite3VdbeMemSetStr
              ((Mem *)((Btree *)context)->db,local_68,-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3DbFree(db,local_68);
  }
  if (iVar11 != 0) {
    sqlite3_result_error_code(context,iVar11);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);

  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

  /* Check for the following errors:
  **
  **     * Too many attached databases,
  **     * Transaction currently open
  **     * Specified database name already being used.
  */
  if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
    zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
      db->aLimit[SQLITE_LIMIT_ATTACHED]
    );
    goto attach_error;
  }
  if( !db->autoCommit ){
    zErrDyn = sqlite3MPrintf(db, "cannot ATTACH database within transaction");
    goto attach_error;
  }
  for(i=0; i<db->nDb; i++){
    char *z = db->aDb[i].zName;
    assert( z && zName );
    if( sqlite3StrICmp(z, zName)==0 ){
      zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
      goto attach_error;
    }
  }

  /* Allocate the new entry in the db->aDb[] array and initialize the schema
  ** hash tables.
  */
  if( db->aDb==db->aDbStatic ){
    aNew = sqlite3DbMallocRaw(db, sizeof(db->aDb[0])*3 );
    if( aNew==0 ) return;
    memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
  }else{
    aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
    if( aNew==0 ) return;
  }
  db->aDb = aNew;
  aNew = &db->aDb[db->nDb];
  memset(aNew, 0, sizeof(*aNew));

  /* Open the database file. If the btree is successfully opened, use
  ** it to obtain the database schema. At this point the schema may
  ** or may not be initialized.
  */
  flags = db->openFlags;
  rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) db->mallocFailed = 1;
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
    return;
  }
  assert( pVfs );
  flags |= SQLITE_OPEN_MAIN_DB;
  rc = sqlite3BtreeOpen(pVfs, zPath, db, &aNew->pBt, 0, flags);
  sqlite3_free( zPath );
  db->nDb++;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    aNew->pSchema = sqlite3SchemaGet(db, aNew->pBt);
    if( !aNew->pSchema ){
      rc = SQLITE_NOMEM;
    }else if( aNew->pSchema->file_format && aNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(aNew->pBt);
    pPager = sqlite3BtreePager(aNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(aNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(aNew->pBt, 3 | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(aNew->pBt);
  }
  aNew->safety_level = 3;
  aNew->zName = sqlite3DbStrDup(db, zName);
  if( rc==SQLITE_OK && aNew->zName==0 ){
    rc = SQLITE_NOMEM;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from the main database */
        sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
        if( nKey>0 || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
          rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        }
        break;
    }
  }
#endif

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the way
  ** we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    rc = sqlite3Init(db, &zErrDyn);
    sqlite3BtreeLeaveAll(db);
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    int iDb = db->nDb - 1;
    assert( iDb>=2 );
    if( db->aDb[iDb].pBt ){
      sqlite3BtreeClose(db->aDb[iDb].pBt);
      db->aDb[iDb].pBt = 0;
      db->aDb[iDb].pSchema = 0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = iDb;
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
      db->mallocFailed = 1;
      sqlite3DbFree(db, zErrDyn);
      zErrDyn = sqlite3MPrintf(db, "out of memory");
    }else if( zErrDyn==0 ){
      zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}